

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astDoWhileContinueWithNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  undefined1 local_98 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_6eb38615 gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar2 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x20);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar2);
  gcFrameRecord.roots[3] = sVar3;
  gcFrameRecord.roots[4] = (context->roots).voidType;
  local_98 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_98);
  if (gcFrameRecord.roots[5] != 0) {
    gcFrame.doWhileNode =
         (sysbvm_astDoWhileContinueWithNode_t *)
         sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                   (context,gcFrameRecord.roots[5],(context->roots).voidType,*psVar2);
    gcFrameRecord.roots[5] = (sysbvm_tuple_t)gcFrame.doWhileNode;
  }
  if (gcFrameRecord.roots[6] != 0) {
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[6],(context->roots).booleanType,*psVar2);
    gcFrameRecord.roots[6] = sVar3;
  }
  if (gcFrameRecord.roots[7] != 0) {
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,gcFrameRecord.roots[7],(context->roots).voidType,*psVar2);
    gcFrameRecord.roots[7] = sVar3;
  }
  if ((gcFrameRecord.roots[6] != 0) &&
     (_Var1 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[6]), _Var1)) {
    sVar3 = sysbvm_astLiteralNode_getValue(gcFrameRecord.roots[6]);
    _Var1 = sysbvm_tuple_boolean_decode(sVar3);
    if (!_Var1) {
      if (gcFrame.doWhileNode == (sysbvm_astDoWhileContinueWithNode_t *)0x0) {
        gcFrame.doWhileNode =
             (sysbvm_astDoWhileContinueWithNode_t *)
             sysbvm_astLiteralNode_create(context,gcFrameRecord.roots[2],0x2f);
      }
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_98);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return (sysbvm_tuple_t)gcFrame.doWhileNode;
    }
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_98);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return (sysbvm_tuple_t)gcFrameRecord.roots;
}

Assistant:

static sysbvm_tuple_t sysbvm_astDoWhileContinueWithNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astDoWhileContinueWithNode_t *doWhileNode;
        sysbvm_tuple_t analyzedBodyExpression;
        sysbvm_tuple_t analyzedConditionExpression;
        sysbvm_tuple_t analyzedContinueExpression;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.doWhileNode = (sysbvm_astDoWhileContinueWithNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.doWhileNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    gcFrame.doWhileNode->super.analyzedType = context->roots.voidType;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.doWhileNode->super.sourcePosition);

    if(gcFrame.doWhileNode->bodyExpression)
    {
        gcFrame.analyzedBodyExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.doWhileNode->bodyExpression, context->roots.voidType, *environment);
        gcFrame.doWhileNode->bodyExpression = gcFrame.analyzedBodyExpression;
    }

    if(gcFrame.doWhileNode->conditionExpression)
    {
        gcFrame.analyzedConditionExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.doWhileNode->conditionExpression, context->roots.booleanType, *environment);
        gcFrame.doWhileNode->conditionExpression = gcFrame.analyzedConditionExpression;
    }

    if(gcFrame.doWhileNode->continueExpression)
    {
        gcFrame.analyzedContinueExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.doWhileNode->continueExpression, context->roots.voidType, *environment);
        gcFrame.doWhileNode->continueExpression = gcFrame.analyzedContinueExpression;
    }

    if(gcFrame.doWhileNode->conditionExpression &&
        sysbvm_astNode_isLiteralNode(context, gcFrame.doWhileNode->conditionExpression) &&
        !sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.doWhileNode->conditionExpression)))
    {
        if(!gcFrame.analyzedBodyExpression)
            gcFrame.analyzedBodyExpression = sysbvm_astLiteralNode_create(context, gcFrame.doWhileNode->super.sourcePosition, SYSBVM_VOID_TUPLE);

        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedBodyExpression;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.doWhileNode;
}